

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O1

MPP_RET mpp_buf_slot_clr_flag(MppBufSlots slots,RK_S32 index,SlotUsageType type)

{
  pthread_mutex_t *__mutex;
  undefined8 in_RAX;
  MPP_RET MVar1;
  uint uVar2;
  MppBufSlotEntry *slot;
  undefined4 uVar3;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_clr_flag");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    __mutex = *slots;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    if ((index < 0) || (*(int *)((long)slots + 0x60) <= index)) {
      _dump_slots("mpp_buf_slot_clr_flag",(MppBufSlotsImpl *)slots);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(index >= 0) && (index < impl->buf_count)","mpp_buf_slot_clr_flag",
                 CONCAT44(uVar3,0x425));
      abort();
    }
    slot = (MppBufSlotEntry *)((ulong)(uint)index * 0x38 + *(long *)((long)slots + 0xe8));
    slot_ops_with_log((MppBufSlotsImpl *)slots,slot,clr_flag_op[type],(void *)0x0);
    if (type == SLOT_HAL_OUTPUT) {
      *(int *)((long)slots + 0xc) = *(int *)((long)slots + 0xc) + 1;
    }
    uVar2 = (slot->status).val & 0x3ffff;
    if (uVar2 == 1) {
      if (slot->frame != (void *)0x0) {
        slot_ops_with_log((MppBufSlotsImpl *)slots,slot,SLOT_CLR_FRAME,slot->frame);
        mpp_frame_deinit(&slot->frame);
      }
      if (slot->buffer != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(slot->buffer,"check_entry_unused");
        slot_ops_with_log((MppBufSlotsImpl *)slots,slot,SLOT_CLR_BUFFER,slot->buffer);
        slot->buffer = (MppBuffer)0x0;
      }
      slot_ops_with_log((MppBufSlotsImpl *)slots,slot,SLOT_CLR_ON_USE,(void *)0x0);
      *(int *)((long)slots + 100) = *(int *)((long)slots + 100) + -1;
    }
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
    MVar1 = MPP_OK;
    if (uVar2 == 1) {
      mpp_callback_f("mpp_buf_slot_clr_flag",(MppCbCtx *)((long)slots + 0x78),slots);
    }
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_buf_slot_clr_flag(MppBufSlots slots, RK_S32 index, SlotUsageType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    RK_S32 unused = 0;
    {
        AutoMutex auto_lock(impl->lock);
        slot_assert(impl, (index >= 0) && (index < impl->buf_count));
        MppBufSlotEntry *slot = &impl->slots[index];
        slot_ops_with_log(impl, slot, clr_flag_op[type], NULL);

        if (type == SLOT_HAL_OUTPUT)
            impl->decode_count++;

        unused = check_entry_unused(impl, slot);
    }

    if (unused)
        mpp_callback(&impl->callback, impl);
    return MPP_OK;
}